

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O2

void P_SetSlopes(void)

{
  line_t_conflict *plVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = 0x2c;
  lVar6 = 0;
  do {
    plVar1 = lines;
    if (numlines <= lVar6) {
      return;
    }
    if ((lines[lVar6].special == 0xb5) &&
       (lines[lVar6].special = 0, plVar1[lVar6].backsector != (sector_t_conflict *)0x0)) {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        uVar2 = *(uint *)((long)lines->args + lVar4 * 4 + lVar5 + -0x2c) & 3;
        if ((lVar4 == 1) && (uVar2 == 0)) {
          uVar2 = (uint)lines[lVar6].args[0] >> 2 & 3;
        }
        lVar3 = 0x78;
        if (uVar2 == 1) {
LAB_004501df:
          P_AlignPlane(*(sector_t_conflict **)((long)lines[lVar6].args + lVar3 + -0x2c),
                       lines + lVar6,(int)lVar4);
        }
        else if (uVar2 == 2) {
          lVar3 = 0x80;
          goto LAB_004501df;
        }
      }
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x98;
  } while( true );
}

Assistant:

void P_SetSlopes ()
{
	int i, s;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Align)
		{
			lines[i].special = 0;
			if (lines[i].backsector != NULL)
			{
				// args[0] is for floor, args[1] is for ceiling
				//
				// As a special case, if args[1] is 0,
				// then args[0], bits 2-3 are for ceiling.
				for (s = 0; s < 2; s++)
				{
					int bits = lines[i].args[s] & 3;

					if (s == 1 && bits == 0)
						bits = (lines[i].args[0] >> 2) & 3;

					if (bits == 1)			// align front side to back
						P_AlignPlane (lines[i].frontsector, lines + i, s);
					else if (bits == 2)		// align back side to front
						P_AlignPlane (lines[i].backsector, lines + i, s);
				}
			}
		}
	}
}